

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist.cpp
# Opt level: O2

int SetPosition(LinkedList *L,int pos)

{
  Node *pNVar1;
  ostream *poVar2;
  int iVar3;
  
  iVar3 = -1;
  if (L->size != 0) {
    if (pos < 0 || L->size <= pos) {
      poVar2 = std::operator<<((ostream *)&std::cout,"position error!");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      pNVar1 = L->front;
      L->currPtr = pNVar1;
      L->prevPtr = (Node *)0x0;
      L->position = 0;
      iVar3 = 0;
      while (pos != iVar3) {
        iVar3 = iVar3 + 1;
        L->position = iVar3;
        L->prevPtr = pNVar1;
        pNVar1 = pNVar1->next;
        L->currPtr = pNVar1;
      }
    }
  }
  return iVar3;
}

Assistant:

int SetPosition(LinkedList *L, int pos) { //重置链表当前结点位置的函数
    if(!L->size) return -1;  //链表为空
    if(pos<0 || pos>L->size-1) {
        cout << "position error!" << endl;
        return -1;
    }
    //寻找对应结点
    L->currPtr = L->front;
    L->prevPtr = NULL;
    L->position = 0;
    for(int i = 0; i < pos; i++) {
        L->position++;
        L->prevPtr = L->currPtr;
        L->currPtr = (L->currPtr)->next;
    }
    return L->position;  //返回当前结点位置
}